

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

BOOL is_startline(PCRE2_SPTR8 code,uint bracket_map,compile_block_8 *cb,int atomcount,BOOL inassert)

{
  bool bVar1;
  ushort uVar2;
  BOOL BVar3;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  byte *code_00;
  
  do {
    pbVar4 = first_significant_code
                       (code + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                               [*code],0);
    bVar6 = *pbVar4;
    if (bVar6 == 0x8b) {
      code_00 = pbVar4 + 3;
      if (pbVar4[3] == 0x77) {
        uVar5 = (ulong)(ushort)(*(ushort *)(pbVar4 + 8) << 8 | *(ushort *)(pbVar4 + 8) >> 8);
LAB_001454d3:
        code_00 = code_00 + uVar5;
      }
      else if (pbVar4[3] == 0x76) {
        uVar5 = 6;
        goto LAB_001454d3;
      }
      bVar1 = false;
      if ((5 < *code_00 - 0x91) && (*code_00 != 0xa3)) {
        BVar3 = is_startline(code_00,bracket_map,cb,atomcount,1);
        if (BVar3 != 0) {
          do {
            uVar2 = *(ushort *)(code_00 + 1) << 8 | *(ushort *)(code_00 + 1) >> 8;
            pbVar4 = code_00 + uVar2;
            code_00 = code_00 + uVar2;
          } while (*pbVar4 == 0x78);
          pbVar4 = first_significant_code(code_00 + 3,0);
          bVar6 = *pbVar4;
          goto LAB_0014553f;
        }
        goto LAB_00145604;
      }
    }
    else {
LAB_0014553f:
      iVar7 = atomcount;
      BVar3 = inassert;
      uVar8 = bracket_map;
      switch(bVar6) {
      case 0x7f:
      case 0x83:
        BVar3 = 1;
        break;
      case 0x80:
      case 0x81:
      case 0x82:
      case 0x84:
      case 0x86:
      case 0x8b:
switchD_00145558_caseD_80:
        if ((byte)(bVar6 - 0x1d) < 0xfe) goto LAB_00145604;
        goto LAB_00145598;
      case 0x85:
        iVar7 = atomcount + 1;
        break;
      case 0x87:
      case 0x88:
      case 0x8c:
      case 0x8d:
        break;
      case 0x89:
      case 0x8a:
      case 0x8e:
      case 0x8f:
        uVar8 = 1 << (pbVar4[4] & 0x1f);
        if (0x1f < CONCAT11(pbVar4[3],pbVar4[4])) {
          uVar8 = 1;
        }
        uVar8 = uVar8 | bracket_map;
        break;
      default:
        if ((1 < bVar6 - 0x55) && (bVar6 != 0x5e)) goto switchD_00145558_caseD_80;
        if (pbVar4[1] == 0xc) {
          bVar1 = false;
          if ((0 < atomcount) || ((cb->backref_map & bracket_map) != 0)) goto LAB_00145606;
          if ((cb->had_pruneorskip != 0 || inassert != 0) || ((cb->external_options & 0x8000) != 0))
          goto LAB_00145604;
          goto LAB_00145598;
        }
        goto LAB_00145604;
      }
      BVar3 = is_startline(pbVar4,uVar8,cb,iVar7,BVar3);
      if (BVar3 == 0) {
LAB_00145604:
        bVar1 = false;
      }
      else {
LAB_00145598:
        code = code + (ushort)(*(ushort *)(code + 1) << 8 | *(ushort *)(code + 1) >> 8);
        bVar1 = true;
      }
    }
LAB_00145606:
    if (!bVar1) {
      return 0;
    }
    if (*code != 0x78) {
      return 1;
    }
  } while( true );
}

Assistant:

static BOOL
is_startline(PCRE2_SPTR code, unsigned int bracket_map, compile_block *cb,
  int atomcount, BOOL inassert)
{
do {
   PCRE2_SPTR scode = first_significant_code(
     code + PRIV(OP_lengths)[*code], FALSE);
   int op = *scode;

   /* If we are at the start of a conditional assertion group, *both* the
   conditional assertion *and* what follows the condition must satisfy the test
   for start of line. Other kinds of condition fail. Note that there may be an
   auto-callout at the start of a condition. */

   if (op == OP_COND)
     {
     scode += 1 + LINK_SIZE;

     if (*scode == OP_CALLOUT) scode += PRIV(OP_lengths)[OP_CALLOUT];
       else if (*scode == OP_CALLOUT_STR) scode += GET(scode, 1 + 2*LINK_SIZE);

     switch (*scode)
       {
       case OP_CREF:
       case OP_DNCREF:
       case OP_RREF:
       case OP_DNRREF:
       case OP_FAIL:
       case OP_FALSE:
       case OP_TRUE:
       return FALSE;

       default:     /* Assertion */
       if (!is_startline(scode, bracket_map, cb, atomcount, TRUE)) return FALSE;
       do scode += GET(scode, 1); while (*scode == OP_ALT);
       scode += 1 + LINK_SIZE;
       break;
       }
     scode = first_significant_code(scode, FALSE);
     op = *scode;
     }

   /* Non-capturing brackets */

   if (op == OP_BRA  || op == OP_BRAPOS ||
       op == OP_SBRA || op == OP_SBRAPOS)
     {
     if (!is_startline(scode, bracket_map, cb, atomcount, inassert))
       return FALSE;
     }

   /* Capturing brackets */

   else if (op == OP_CBRA  || op == OP_CBRAPOS ||
            op == OP_SCBRA || op == OP_SCBRAPOS)
     {
     int n = GET2(scode, 1+LINK_SIZE);
     unsigned int new_map = bracket_map | ((n < 32)? (1u << n) : 1);
     if (!is_startline(scode, new_map, cb, atomcount, inassert)) return FALSE;
     }

   /* Positive forward assertions */

   else if (op == OP_ASSERT || op == OP_ASSERT_NA)
     {
     if (!is_startline(scode, bracket_map, cb, atomcount, TRUE))
       return FALSE;
     }

   /* Atomic brackets */

   else if (op == OP_ONCE)
     {
     if (!is_startline(scode, bracket_map, cb, atomcount + 1, inassert))
       return FALSE;
     }

   /* .* means "start at start or after \n" if it isn't in atomic brackets or
   brackets that may be referenced or an assertion, and as long as the pattern
   does not contain *PRUNE or *SKIP, because these break the feature. Consider,
   for example, /.*?a(*PRUNE)b/ with the subject "aab", which matches "ab",
   i.e. not at the start of a line. There is also an option that disables this
   optimization. */

   else if (op == OP_TYPESTAR || op == OP_TYPEMINSTAR || op == OP_TYPEPOSSTAR)
     {
     if (scode[1] != OP_ANY || (bracket_map & cb->backref_map) != 0 ||
         atomcount > 0 || cb->had_pruneorskip || inassert ||
         (cb->external_options & PCRE2_NO_DOTSTAR_ANCHOR) != 0)
       return FALSE;
     }

   /* Check for explicit circumflex; anything else gives a FALSE result. Note
   in particular that this includes atomic brackets OP_ONCE because the number
   of characters matched by .* cannot be adjusted inside them. */

   else if (op != OP_CIRC && op != OP_CIRCM) return FALSE;

   /* Move on to the next alternative */

   code += GET(code, 1);
   }
while (*code == OP_ALT);  /* Loop for each alternative */
return TRUE;
}